

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.cc
# Opt level: O0

CallFrame * __thiscall pstack::Dwarf::FDE::defaultFrame(CallFrame *__return_storage_ptr__,FDE *this)

{
  CIE *pCVar1;
  undefined1 local_68 [8];
  CallFrame dframe;
  FDE *this_local;
  
  dframe.cfaValue.u.expression.length = (Off)this;
  CallFrame::CallFrame((CallFrame *)local_68);
  pCVar1 = this->cie;
  CIE::execInsns<pstack::Dwarf::FDE::defaultFrame()const::__0>
            (__return_storage_ptr__,pCVar1,(CallFrame *)local_68,pCVar1->initial_instructions,
             pCVar1->end,0);
  CallFrame::~CallFrame((CallFrame *)local_68);
  return __return_storage_ptr__;
}

Assistant:

CallFrame
FDE::defaultFrame() const {
   CallFrame dframe;
   // Execute all of the initial_instructions in the CIE, creating the starting
   // point for a frame. XXX: It might be worth caching this in the CIE, but
   // there's rarely a huge number of instructions here .
   // The initial instructions extend from the given point in the CIE to the
   // end of its extent.
   return cie.execInsns(dframe, cie.initial_instructions, cie.end, 0,
         [](uintmax_t, CallFrame &) { return false; });
}